

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  int32_t i_00;
  container_t *c_00;
  array_container_t *new_typecode;
  int32_t *in_RCX;
  uint8_t *in_RDX;
  roaring_array_t *in_RDI;
  container_t *c_1;
  array_container_t *new_ac;
  container_t *c2;
  uint8_t new_type;
  container_t *c;
  int i;
  uint16_t hb;
  roaring_array_t *ra;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  uint8_t in_stack_ffffffffffffff9f;
  roaring_array_t *in_stack_ffffffffffffffa0;
  uint8_t *in_stack_ffffffffffffffa8;
  roaring_array_t *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  uint8_t typecode;
  container_t *local_8;
  
  i_00 = ra_get_index((roaring_array_t *)
                      CONCAT17(in_stack_ffffffffffffff9f,
                               CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),0);
  if (i_00 < 0) {
    new_typecode = array_container_create();
    local_8 = container_add((container_t *)
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                            (uint16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30),
                            (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x28),
                            (uint8_t *)new_typecode);
    ra_insert_new_key_value_at
              (in_stack_ffffffffffffffb0,(int32_t)((ulong)new_typecode >> 0x20),
               (uint16_t)((ulong)new_typecode >> 0x10),local_8,in_stack_ffffffffffffff9f);
    *in_RCX = -1 - i_00;
  }
  else {
    ra_unshare_container_at_index
              (in_stack_ffffffffffffffa0,
               CONCAT11(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff9e));
    local_8 = ra_get_container_at_index(in_RDI,(uint16_t)i_00,in_RDX);
    typecode = *in_RDX;
    c_00 = container_add((container_t *)CONCAT17(typecode,in_stack_ffffffffffffffb8),
                         (uint16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x28),
                         in_stack_ffffffffffffffa8);
    *in_RCX = i_00;
    if (c_00 != local_8) {
      container_free(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
      ra_set_container_at_index(in_RDI,i_00,c_00,typecode);
      *in_RDX = typecode;
      local_8 = c_00;
    }
  }
  return local_8;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(roaring_bitmap_t *r,
                                                           uint32_t val,
                                                           uint8_t *type,
                                                           int *index) {
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *c = ra_get_container_at_index(ra, (uint16_t)i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c =
            container_add(new_ac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}